

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

void __thiscall cppnet::BaseLogger::~BaseLogger(BaseLogger *this)

{
  SetLevel(this,LL_NULL);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::~_Deque_base
            ((_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_> *)
             &(this->_cache_queue)._queue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

BaseLogger::~BaseLogger() {
    SetLevel(LL_NULL);
}